

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

JavascriptString *
Js::JavascriptNumber::ToStringRadixHelper(double value,int radix,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptString *pJVar5;
  char *message;
  char *error;
  uint lineNumber;
  WCHAR local_a28 [4];
  char16 szBuffer [1280];
  
  szBuffer._2552_8_ = value;
  if (radix == 10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(radix != 10)";
    message = "radix != 10";
    lineNumber = 0x3dc;
  }
  else {
    if (radix - 2U < 0x23) goto LAB_00b8ced7;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(radix >= 2 && radix <= 36)";
    message = "radix >= 2 && radix <= 36";
    lineNumber = 0x3dd;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                              ,lineNumber,error,message);
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00b8ced7:
  pJVar5 = ToStringNanOrInfiniteOrZero((double)szBuffer._2552_8_,scriptContext);
  if (pJVar5 == (JavascriptString *)0x0) {
    BVar3 = NumberUtilities::FNonZeroFiniteDblToStr((double)szBuffer._2552_8_,radix,local_a28,0x500)
    ;
    if (BVar3 == 0) {
      JavascriptError::ThrowOutOfMemoryError(scriptContext);
    }
    pJVar5 = JavascriptString::NewCopySz(local_a28,scriptContext);
  }
  return pJVar5;
}

Assistant:

JavascriptString* JavascriptNumber::ToStringRadixHelper(double value, int radix, ScriptContext* scriptContext)
    {
        Assert(radix != 10);
        Assert(radix >= 2 && radix <= 36);

        JavascriptString* string = ToStringNanOrInfiniteOrZero(value, scriptContext);
        if (string != nullptr)
        {
            return string;
        }

        char16 szBuffer[bufSize];

        if (!Js::NumberUtilities::FNonZeroFiniteDblToStr(value, radix, szBuffer, _countof(szBuffer)))
        {
            Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
        }

        return JavascriptString::NewCopySz(szBuffer, scriptContext);
    }